

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O0

int __thiscall gl4cts::KHRDebug::TestBase::init(TestBase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestBase *this_local;
  
  if ((this->m_is_debug & 1U) == 1) {
    initDebug(this);
  }
  else {
    initNonDebug(this);
  }
  pRVar2 = deqp::Context::getRenderContext(this->m_test_base_context);
  this->m_orig_rc = pRVar2;
  deqp::Context::setRenderContext(this->m_test_base_context,this->m_rc);
  iVar1 = (*this->m_rc->_vptr_RenderContext[3])();
  this->m_gl = (Functions *)CONCAT44(extraout_var,iVar1);
  return (int)this;
}

Assistant:

void TestBase::init()
{
	if (true == m_is_debug)
	{
		initDebug();
	}
	else
	{
		initNonDebug();
	}

	m_orig_rc = &m_test_base_context.getRenderContext();
	m_test_base_context.setRenderContext(m_rc);

	/* Get functions */
	m_gl = &m_rc->getFunctions();
}